

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void __thiscall
bk_lib::pod_vector<long,_std::allocator<long>_>::resize
          (pod_vector<long,_std::allocator<long>_> *this,size_type ns,long *val)

{
  size_type sVar1;
  iterator first;
  iterator plVar2;
  long *in_RDX;
  uint in_ESI;
  pod_vector<long,_std::allocator<long>_> *in_RDI;
  pod_vector<long,_std::allocator<long>_> *unaff_retaddr;
  undefined4 in_stack_fffffffffffffff0;
  uint uVar3;
  uint uVar4;
  size_type sVar5;
  pod_vector<long,_std::allocator<long>_> *ppVar6;
  size_type n;
  
  uVar3 = in_ESI;
  ppVar6 = in_RDI;
  sVar1 = size(in_RDI);
  n = (size_type)((ulong)ppVar6 >> 0x20);
  uVar4 = uVar3;
  if (sVar1 < in_ESI) {
    sVar1 = capacity(in_RDI);
    if (sVar1 < uVar3) {
      size(in_RDI);
      append_realloc(unaff_retaddr,n,(long *)CONCAT44(uVar4,in_stack_fffffffffffffff0));
    }
    else {
      first = end(in_RDI);
      plVar2 = end(in_RDI);
      sVar5 = uVar4;
      sVar1 = size(in_RDI);
      detail::fill<long>(first,plVar2 + (uVar4 - sVar1),in_RDX);
      uVar4 = sVar5;
    }
  }
  (in_RDI->ebo_).size = uVar4;
  return;
}

Assistant:

void resize(size_type ns, const T& val = T()) {
		if (ns > size()) {
			ns <= capacity() ? detail::fill(end(), end()+(ns-size()), val) : append_realloc(ns-size(), val);
		}
		ebo_.size = ns;
	}